

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vk_mem_alloc.h
# Opt level: O3

void __thiscall VmaBlockVector::PrintDetailedMap(VmaBlockVector *this,VmaJsonWriter *json)

{
  bool bVar1;
  VmaVector<char,_VmaStlAllocator<char>_> *pVVar2;
  size_t sVar3;
  VmaStringBuilder *this_00;
  bool bVar4;
  uint uVar5;
  ulong uVar6;
  byte *pStr;
  byte local_32 [2];
  
  bVar1 = this->m_hAllocator->m_UseMutex;
  if (bVar1 == true) {
    std::__shared_mutex_pthread::lock_shared((__shared_mutex_pthread *)&this->m_Mutex);
  }
  VmaJsonWriter::BeginObject(json,false);
  if ((this->m_Blocks).m_Count != 0) {
    uVar6 = 0;
    do {
      VmaJsonWriter::BeginValue(json,false);
      pVVar2 = &json->m_SB->m_Data;
      sVar3 = pVVar2->m_Count;
      VmaVector<char,_VmaStlAllocator<char>_>::resize(pVVar2,sVar3 + 1);
      pVVar2->m_pArray[sVar3] = '\"';
      json->m_InsideString = true;
      this_00 = json->m_SB;
      local_32[1] = 0;
      pStr = local_32 + 1;
      uVar5 = (this->m_Blocks).m_pArray[uVar6]->m_Id;
      do {
        pStr[-1] = (char)uVar5 + (char)(uVar5 / 10) * -10 | 0x30;
        pStr = pStr + -1;
        bVar4 = 9 < uVar5;
        uVar5 = uVar5 / 10;
      } while (bVar4);
      VmaStringBuilder::Add(this_00,(char *)pStr);
      pVVar2 = &json->m_SB->m_Data;
      sVar3 = pVVar2->m_Count;
      VmaVector<char,_VmaStlAllocator<char>_>::resize(pVVar2,sVar3 + 1);
      pVVar2->m_pArray[sVar3] = '\"';
      json->m_InsideString = false;
      VmaJsonWriter::BeginObject(json,false);
      VmaJsonWriter::BeginString(json,"MapRefCount");
      pVVar2 = &json->m_SB->m_Data;
      sVar3 = pVVar2->m_Count;
      VmaVector<char,_VmaStlAllocator<char>_>::resize(pVVar2,sVar3 + 1);
      pVVar2->m_pArray[sVar3] = '\"';
      json->m_InsideString = false;
      VmaJsonWriter::WriteNumber(json,(this->m_Blocks).m_pArray[uVar6]->m_MapCount);
      (*(this->m_Blocks).m_pArray[uVar6]->m_pMetadata->_vptr_VmaBlockMetadata[0x10])();
      VmaJsonWriter::EndObject(json);
      uVar6 = uVar6 + 1;
    } while (uVar6 < (this->m_Blocks).m_Count);
  }
  VmaJsonWriter::EndObject(json);
  if (bVar1 != false) {
    pthread_rwlock_unlock((pthread_rwlock_t *)&this->m_Mutex);
    return;
  }
  return;
}

Assistant:

void VmaBlockVector::PrintDetailedMap(class VmaJsonWriter& json)
{
    VmaMutexLockRead lock(m_Mutex, m_hAllocator->m_UseMutex);


    json.BeginObject();
    for (size_t i = 0; i < m_Blocks.size(); ++i)
    {
        json.BeginString();
        json.ContinueString(m_Blocks[i]->GetId());
        json.EndString();

        json.BeginObject();
        json.WriteString("MapRefCount");
        json.WriteNumber(m_Blocks[i]->GetMapRefCount());

        m_Blocks[i]->m_pMetadata->PrintDetailedMap(json);
        json.EndObject();
    }
    json.EndObject();
}